

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint *
create_capture_parameter_constraint(char *parameter_name,void *capture_to,size_t size_to_capture)

{
  Constraint *pCVar1;
  
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  pCVar1->type = CGREEN_CAPTURE_PARAMETER_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = capture_parameter;
  pCVar1->name = "capture parameter";
  make_cgreen_pointer_value(&pCVar1->expected_value,capture_to);
  pCVar1->size_of_expected_value = size_to_capture;
  pCVar1->parameter_name = parameter_name;
  return pCVar1;
}

Assistant:

Constraint *create_capture_parameter_constraint(const char *parameter_name, void *capture_to, size_t size_to_capture) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CAPTURE_PARAMETER_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &capture_parameter;
    constraint->name = "capture parameter";
    constraint->expected_value = make_cgreen_pointer_value(capture_to);
    constraint->size_of_expected_value = size_to_capture;
    constraint->parameter_name = parameter_name;

    return constraint;
}